

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_comparator.cc
# Opt level: O0

bool __thiscall
google::protobuf::util::SimpleFieldComparator::CompareDoubleOrFloat<float>
          (SimpleFieldComparator *this,FieldDescriptor *field,float value_1,float value_2)

{
  bool bVar1;
  uint uVar2;
  pointer prVar3;
  double dVar4;
  iterator local_58;
  FieldDescriptor *local_48;
  undefined1 local_40 [8];
  iterator it;
  Tolerance *tolerance;
  float value_2_local;
  float value_1_local;
  FieldDescriptor *field_local;
  SimpleFieldComparator *this_local;
  
  if ((value_1 != value_2) || (NAN(value_1) || NAN(value_2))) {
    if (this->float_comparison_ == EXACT) {
      if ((((this->treat_nan_as_equal_ & 1U) == 0) ||
          (uVar2 = std::isnan((double)(ulong)(uint)value_1), (uVar2 & 1) == 0)) ||
         (uVar2 = std::isnan((double)(ulong)(uint)value_2), (uVar2 & 1) == 0)) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else if ((((this->treat_nan_as_equal_ & 1U) == 0) ||
             (uVar2 = std::isnan((double)(ulong)(uint)value_1), (uVar2 & 1) == 0)) ||
            (uVar2 = std::isnan((double)(ulong)(uint)value_2), (uVar2 & 1) == 0)) {
      it.field_1.slot_ = (slot_type *)0x0;
      if ((this->has_default_tolerance_ & 1U) != 0) {
        it.field_1.slot_ = (slot_type *)&this->default_tolerance_;
      }
      local_48 = field;
      _local_40 = absl::lts_20250127::container_internal::
                  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,google::protobuf::util::SimpleFieldComparator::Tolerance>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::util::SimpleFieldComparator::Tolerance>>>
                  ::find<google::protobuf::FieldDescriptor_const*>
                            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,google::protobuf::util::SimpleFieldComparator::Tolerance>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::util::SimpleFieldComparator::Tolerance>>>
                              *)&this->map_tolerance_,&local_48);
      local_58 = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_google::protobuf::util::SimpleFieldComparator::Tolerance>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::util::SimpleFieldComparator::Tolerance>_>_>
                 ::end((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_google::protobuf::util::SimpleFieldComparator::Tolerance>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::util::SimpleFieldComparator::Tolerance>_>_>
                        *)&this->map_tolerance_);
      bVar1 = absl::lts_20250127::container_internal::operator!=((iterator *)local_40,&local_58);
      if (bVar1) {
        prVar3 = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_google::protobuf::util::SimpleFieldComparator::Tolerance>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::util::SimpleFieldComparator::Tolerance>_>_>
                 ::iterator::operator->((iterator *)local_40);
        it.field_1.slot_ = (slot_type *)&prVar3->second;
      }
      if (it.field_1.slot_ == (slot_type *)0x0) {
        dVar4 = std::fabs((double)(ulong)(uint)value_1);
        if ((3.8146973e-06 < SUB84(dVar4,0)) ||
           (dVar4 = std::fabs((double)(ulong)(uint)value_2), 3.8146973e-06 < SUB84(dVar4,0))) {
          this_local._7_1_ =
               anon_unknown_4::WithinFractionOrMargin<float>
                         (value_1,value_2,3.8146973e-06,3.8146973e-06);
        }
        else {
          this_local._7_1_ = true;
        }
      }
      else {
        this_local._7_1_ =
             anon_unknown_4::WithinFractionOrMargin<float>
                       (value_1,value_2,(float)*(double *)it.field_1.slot_,
                        (float)*(double *)((long)it.field_1.slot_ + 8));
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool SimpleFieldComparator::CompareDoubleOrFloat(const FieldDescriptor& field,
                                                 T value_1, T value_2) {
  if (value_1 == value_2) {
    // Covers +inf and -inf (which are not within margin or fraction of
    // themselves), and is a shortcut for finite values.
    return true;
  } else if (float_comparison_ == EXACT) {
    if (treat_nan_as_equal_ && std::isnan(value_1) && std::isnan(value_2)) {
      return true;
    }
    return false;
  } else {
    if (treat_nan_as_equal_ && std::isnan(value_1) && std::isnan(value_2)) {
      return true;
    }
    // float_comparison_ == APPROXIMATE covers two use cases.
    Tolerance* tolerance = nullptr;
    if (has_default_tolerance_) tolerance = &default_tolerance_;

    auto it = map_tolerance_.find(&field);
    if (it != map_tolerance_.end()) {
      tolerance = &it->second;
    }

    if (tolerance != nullptr) {
      // Use user-provided fraction and margin. Since they are stored as
      // doubles, we explicitly cast them to types of values provided. This
      // is very likely to fail if provided values are not numeric.
      return WithinFractionOrMargin(value_1, value_2,
                                    static_cast<T>(tolerance->fraction),
                                    static_cast<T>(tolerance->margin));
    } else {
      if (std::fabs(value_1) <= Epsilon<T>::value &&
          std::fabs(value_2) <= Epsilon<T>::value) {
        return true;
      }
      return WithinFractionOrMargin(value_1, value_2, Epsilon<T>::value,
                                    Epsilon<T>::value);
    }
  }
}